

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O0

void anon_unknown.dwarf_1c5214::testAllCombinations
               (bool isAligned,bool isStereo,Compression pCompression,string *tempDir)

{
  int pHeight_00;
  int pWidth_00;
  char *pcVar1;
  char *pcVar2;
  char *__filename;
  ostream *poVar3;
  byte in_SIL;
  byte in_DIL;
  int pWidth;
  int pHeight;
  char *pRgbaFilename;
  char *pRgbFilename;
  string pRgba;
  string pRgb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  allocator<char> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> *pFilename;
  string local_b0 [39];
  undefined1 local_89 [33];
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [46];
  byte local_2;
  byte local_1;
  
  local_1 = in_DIL & 1;
  local_2 = in_SIL & 1;
  pcVar1 = "imf_optimized_aces_rgb.exr";
  if (local_2 != 0) {
    pcVar1 = "imf_optimized_aces_rgb_stereo.exr";
  }
  pFilename = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::allocator<char>::~allocator(&local_31);
  std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  psVar4 = local_68;
  std::__cxx11::string::operator=(local_30,psVar4);
  std::__cxx11::string::~string(psVar4);
  pcVar2 = "imf_optimized_aces_rgba.exr";
  if ((local_2 & 1) != 0) {
    pcVar2 = "imf_optimized_aces_rgba_stereo.exr";
  }
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,pcVar2,(allocator<char> *)psVar4);
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  psVar4 = local_b0;
  std::__cxx11::string::operator=((string *)(local_89 + 1),psVar4);
  std::__cxx11::string::~string(psVar4);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  __filename = (char *)std::__cxx11::string::c_str();
  pHeight_00 = (local_1 & 1) + 0x47f;
  pWidth_00 = (local_1 & 1) + 0x7ff;
  remove(pcVar2);
  remove(__filename);
  writeFile(__filename,pHeight_00,pWidth_00,(EImageType)((ulong)pFilename >> 0x20),
            SUB81((ulong)pFilename >> 0x18,0),(Compression)((ulong)pcVar1 >> 0x20));
  writeFile(__filename,pHeight_00,pWidth_00,(EImageType)((ulong)pFilename >> 0x20),
            SUB81((ulong)pFilename >> 0x18,0),(Compression)((ulong)pcVar1 >> 0x20));
  poVar3 = std::operator<<((ostream *)&std::cout,"\t\tRGB file to RGB framebuffer");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  readValidateFile((char *)pFilename,(int)((ulong)pcVar1 >> 0x20),(int)pcVar1,
                   (EImageType)((ulong)this >> 0x20),SUB81((ulong)this >> 0x18,0));
  poVar3 = std::operator<<((ostream *)&std::cout,"\t\tRGB file to RGB framebuffer");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  readValidateFile((char *)pFilename,(int)((ulong)pcVar1 >> 0x20),(int)pcVar1,
                   (EImageType)((ulong)this >> 0x20),SUB81((ulong)this >> 0x18,0));
  poVar3 = std::operator<<((ostream *)&std::cout,"\t\tRGB file to RGBA framebuffer");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  readValidateFile((char *)pFilename,(int)((ulong)pcVar1 >> 0x20),(int)pcVar1,
                   (EImageType)((ulong)this >> 0x20),SUB81((ulong)this >> 0x18,0));
  poVar3 = std::operator<<((ostream *)&std::cout,"\t\tRGBA file to RGB framebuffer");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  readValidateFile((char *)pFilename,(int)((ulong)pcVar1 >> 0x20),(int)pcVar1,
                   (EImageType)((ulong)this >> 0x20),SUB81((ulong)this >> 0x18,0));
  poVar3 = std::operator<<((ostream *)&std::cout,"\t\tRGBA file to RGBA framebuffer");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  readValidateFile((char *)pFilename,(int)((ulong)pcVar1 >> 0x20),(int)pcVar1,
                   (EImageType)((ulong)this >> 0x20),SUB81((ulong)this >> 0x18,0));
  remove(pcVar2);
  remove(__filename);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
testAllCombinations (
    bool               isAligned,
    bool               isStereo,
    Compression        pCompression,
    const std::string& tempDir)
{
    std::string pRgb  = isStereo ? RGB_STEREO_FILENAME : RGB_FILENAME;
    pRgb              = tempDir + pRgb;
    std::string pRgba = isStereo ? RGBA_STEREO_FILENAME : RGBA_FILENAME;
    pRgba             = tempDir + pRgba;

    const char* pRgbFilename  = pRgb.c_str ();
    const char* pRgbaFilename = pRgba.c_str ();

    const int pHeight = isAligned ? IMAGE_2K_HEIGHT : IMAGE_2K_HEIGHT - 1;
    const int pWidth  = isAligned ? IMAGE_2K_WIDTH : IMAGE_2K_WIDTH - 1;

    remove (pRgbFilename);
    remove (pRgbaFilename);

    writeFile (
        pRgbFilename, pHeight, pWidth, IMAGE_TYPE_RGB, isStereo, pCompression);
    writeFile (
        pRgbaFilename,
        pHeight,
        pWidth,
        IMAGE_TYPE_RGBA,
        isStereo,
        pCompression);

    cout << "\t\tRGB file to RGB framebuffer" << endl;
    readValidateFile (pRgbFilename, pHeight, pWidth, IMAGE_TYPE_RGB, isStereo);

    cout << "\t\tRGB file to RGB framebuffer" << endl;
    readValidateFile (pRgbFilename, pHeight, pWidth, IMAGE_TYPE_RGB, isStereo);

    cout << "\t\tRGB file to RGBA framebuffer" << endl;
    readValidateFile (pRgbFilename, pHeight, pWidth, IMAGE_TYPE_RGBA, isStereo);

    cout << "\t\tRGBA file to RGB framebuffer" << endl;
    readValidateFile (pRgbaFilename, pHeight, pWidth, IMAGE_TYPE_RGB, isStereo);

    cout << "\t\tRGBA file to RGBA framebuffer" << endl;
    readValidateFile (
        pRgbaFilename, pHeight, pWidth, IMAGE_TYPE_RGBA, isStereo);

    remove (pRgbFilename);
    remove (pRgbaFilename);
}